

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

TextureGatherCase *
deqp::gles31::Functional::anon_unknown_0::makeTextureGatherCase
          (TextureType textureType,Context *context,char *name,char *description,
          GatherType gatherType,OffsetSize offsetSize,TextureFormat textureFormat,
          CompareMode shadowCompareMode,WrapMode wrapS,WrapMode wrapT,
          MaybeTextureSwizzle *texSwizzle,FilterMode minFilter,FilterMode magFilter,int baseLevel,
          IVec3 *textureSize,deUint32 flags)

{
  undefined4 uVar1;
  TextureGatherCase *this;
  TextureFormat *pTVar2;
  undefined4 in_stack_00000044;
  deUint32 dVar3;
  TextureFormat local_50;
  _func_int **local_48;
  undefined8 uStack_40;
  
  if (textureType == TEXTURETYPE_2D_ARRAY) {
    dVar3 = 0x5eed77;
    this = (TextureGatherCase *)operator_new(400);
    TextureGatherCase::TextureGatherCase
              (this,context,name,(char *)0x2,(TextureType)description,gatherType,offsetSize,
               (TextureFormat)((ulong)textureFormat & 0xffffffff),shadowCompareMode,wrapS,wrapT,
               (MaybeTextureSwizzle *)((ulong)texSwizzle & 0xffffffff),minFilter,magFilter,
               (int)textureSize,dVar3);
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureGather2DArrayCase_00b39cd8;
    this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         *(_func_int ***)CONCAT44(in_stack_00000044,baseLevel);
    *(undefined4 *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
         *(undefined4 *)((undefined8 *)CONCAT44(in_stack_00000044,baseLevel) + 1);
    this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    local_50.order = CHANNELORDER_LAST;
    local_50.type = CHANNELTYPE_LAST;
    tcu::Texture2DArray::Texture2DArray
              ((Texture2DArray *)
               &this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2,&local_50,1,1,1)
    ;
    pTVar2 = (TextureFormat *)&this[1].m_gatherType;
  }
  else if (textureType == TEXTURETYPE_CUBE) {
    dVar3 = 0x5eecbb;
    this = (TextureGatherCase *)operator_new(0x298);
    uVar1 = *(undefined4 *)CONCAT44(in_stack_00000044,baseLevel);
    TextureGatherCase::TextureGatherCase
              (this,context,name,&DAT_00000001,TEXTURETYPE_2D,GATHERTYPE_BASIC,offsetSize,
               (TextureFormat)((ulong)textureFormat & 0xffffffff),shadowCompareMode,wrapS,wrapT,
               (MaybeTextureSwizzle *)((ulong)texSwizzle & 0xffffffff),minFilter,magFilter,
               (int)textureSize,dVar3);
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureGatherCubeCase_00b39d58;
    *(undefined4 *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
    this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    local_50.order = CHANNELORDER_LAST;
    local_50.type = CHANNELTYPE_LAST;
    tcu::TextureCube::TextureCube
              ((TextureCube *)
               &this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length,
               &local_50,1);
    pTVar2 = &this[2].m_textureFormat;
  }
  else {
    if (textureType != TEXTURETYPE_2D) {
      return (TextureGatherCase *)0x0;
    }
    dVar3 = 0x5eebe4;
    this = (TextureGatherCase *)operator_new(0x180);
    local_48 = *(_func_int ***)CONCAT44(in_stack_00000044,baseLevel);
    uStack_40 = 0;
    TextureGatherCase::TextureGatherCase
              (this,context,name,(char *)0x0,(TextureType)description,gatherType,offsetSize,
               (TextureFormat)((ulong)textureFormat & 0xffffffff),shadowCompareMode,wrapS,wrapT,
               (MaybeTextureSwizzle *)((ulong)texSwizzle & 0xffffffff),minFilter,magFilter,
               (int)textureSize,dVar3);
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureGather2DCase_00b39ac8;
    this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = local_48;
    this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    local_50.order = CHANNELORDER_LAST;
    local_50.type = CHANNELTYPE_LAST;
    tcu::Texture2D::Texture2D
              ((Texture2D *)
               &this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length,
               &local_50,1,1);
    pTVar2 = (TextureFormat *)
             ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_children.
                     super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                     super__Vector_impl_data + 0x10);
  }
  pTVar2->order = R;
  pTVar2->type = SNORM_INT8;
  pTVar2[1].order = R;
  pTVar2[1].type = SNORM_INT8;
  pTVar2[2].order = R;
  pTVar2[2].type = SNORM_INT8;
  return this;
}

Assistant:

static inline TextureGatherCase* makeTextureGatherCase (TextureType					textureType,
														Context&					context,
														const char*					name,
														const char*					description,
														GatherType					gatherType,
														OffsetSize					offsetSize,
														tcu::TextureFormat			textureFormat,
														tcu::Sampler::CompareMode	shadowCompareMode,
														tcu::Sampler::WrapMode		wrapS,
														tcu::Sampler::WrapMode		wrapT,
														const MaybeTextureSwizzle&	texSwizzle,
														tcu::Sampler::FilterMode	minFilter,
														tcu::Sampler::FilterMode	magFilter,
														int							baseLevel,
														const IVec3&				textureSize,
														deUint32					flags = 0)
{
	switch (textureType)
	{
		case TEXTURETYPE_2D:
			return new TextureGather2DCase(context, name, description, gatherType, offsetSize, textureFormat, shadowCompareMode,
										   wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize.swizzle(0, 1));

		case TEXTURETYPE_2D_ARRAY:
			return new TextureGather2DArrayCase(context, name, description, gatherType, offsetSize, textureFormat, shadowCompareMode,
												wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize);

		case TEXTURETYPE_CUBE:
			DE_ASSERT(gatherType == GATHERTYPE_BASIC);
			DE_ASSERT(offsetSize == OFFSETSIZE_NONE);
			return new TextureGatherCubeCase(context, name, description, textureFormat, shadowCompareMode,
											 wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize.x());

		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}